

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::duplicate_contents(Tree *this,Tree *src,size_t node,size_t where)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t after;
  csubstr cVar7;
  char msg [31];
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  if (src == (Tree *)0x0) {
    builtin_strncpy(msg,"check failed: (src != nullptr)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_30 = cVar7.len;
    pcStack_38 = cVar7.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x65cf) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x65cf) << 0x40,8);
    LVar3.name.str = pcStack_38;
    LVar3.name.len = local_30;
    (*p_Var1)(msg,0x1f,LVar3,(this->m_callbacks).m_user_data);
  }
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (node != NONE)",0x1d);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_58 = cVar7.len;
    pcStack_60 = cVar7.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x65d0) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x65d0) << 0x40,8);
    LVar4.name.str = pcStack_60;
    LVar4.name.len = local_58;
    (*p_Var1)(msg,0x1d,LVar4,(this->m_callbacks).m_user_data);
  }
  if (where == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (where != NONE)",0x1e);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar7 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_80 = cVar7.len;
    pcStack_88 = cVar7.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x65d1) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x65d1) << 0x40,8);
    LVar5.name.str = pcStack_88;
    LVar5.name.len = local_80;
    (*p_Var1)(msg,0x1e,LVar5,(this->m_callbacks).m_user_data);
  }
  _copy_props_wo_key(this,where,src,node);
  after = last_child(this,where);
  duplicate_children(this,src,node,where,after);
  return;
}

Assistant:

void Tree::duplicate_contents(Tree const *src, size_t node, size_t where)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, where != NONE);
    _copy_props_wo_key(where, src, node);
    duplicate_children(src, node, where, last_child(where));
}